

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int ptls_build_certificate_message
              (ptls_buffer_t *buf,ptls_iovec_t context,ptls_iovec_t *certificates,
              size_t num_certificates,ptls_iovec_t ocsp_status)

{
  uint8_t *puVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  int iVar9;
  size_t sVar10;
  bool bVar11;
  
  sVar8 = context.len;
  iVar2 = ptls_buffer_reserve(buf,1);
  if (iVar2 == 0) {
    buf->base[buf->off] = '\0';
    buf->off = buf->off + 1;
    iVar2 = 0;
  }
  bVar11 = false;
  if (iVar2 != 0) goto LAB_00108aa8;
  sVar10 = buf->off;
  if (sVar8 == 0) {
LAB_00108a8e:
    iVar2 = 0;
  }
  else {
    iVar2 = ptls_buffer_reserve(buf,sVar8);
    if (iVar2 == 0) {
      memcpy(buf->base + buf->off,context.base,sVar8);
      buf->off = buf->off + sVar8;
      goto LAB_00108a8e;
    }
  }
  if (iVar2 == 0) {
    buf->base[sVar10 - 1] = (char)(int)buf->off - (char)sVar10;
    bVar11 = true;
  }
  else {
    bVar11 = false;
  }
LAB_00108aa8:
  if (bVar11) {
    iVar2 = ptls_buffer_reserve(buf,3);
    if (iVar2 == 0) {
      puVar1 = buf->base;
      sVar8 = buf->off;
      puVar1[sVar8 + 2] = '\0';
      puVar1 = puVar1 + sVar8;
      puVar1[0] = '\0';
      puVar1[1] = '\0';
      buf->off = buf->off + 3;
      iVar2 = 0;
    }
    if (iVar2 == 0) {
      sVar8 = buf->off;
      if (num_certificates == 0) {
        iVar2 = 0;
        bVar11 = true;
      }
      else {
        sVar10 = 0;
        do {
          iVar2 = ptls_buffer_reserve(buf,3);
          if (iVar2 == 0) {
            puVar1 = buf->base;
            sVar7 = buf->off;
            puVar1[sVar7 + 2] = '\0';
            puVar1 = puVar1 + sVar7;
            puVar1[0] = '\0';
            puVar1[1] = '\0';
            buf->off = buf->off + 3;
            iVar2 = 0;
          }
          iVar9 = 6;
          if (iVar2 == 0) {
            sVar7 = buf->off;
            sVar5 = certificates[sVar10].len;
            iVar2 = 0;
            if (sVar5 != 0) {
              puVar1 = certificates[sVar10].base;
              iVar2 = ptls_buffer_reserve(buf,sVar5);
              if (iVar2 == 0) {
                memcpy(buf->base + buf->off,puVar1,sVar5);
                buf->off = buf->off + sVar5;
                iVar2 = 0;
              }
            }
            if (iVar2 == 0) {
              uVar4 = buf->off - sVar7;
              lVar3 = 0x10;
              do {
                buf->base[sVar7 - 3] = (uint8_t)(uVar4 >> ((byte)lVar3 & 0x3f));
                lVar3 = lVar3 + -8;
                sVar7 = sVar7 + 1;
              } while (lVar3 != -8);
              iVar9 = 0;
              bVar11 = true;
            }
            else {
              bVar11 = false;
            }
          }
          else {
            bVar11 = false;
          }
          if (!bVar11) goto LAB_00108dd5;
          iVar2 = ptls_buffer_reserve(buf,2);
          if (iVar2 == 0) {
            puVar1 = buf->base;
            sVar7 = buf->off;
            (puVar1 + sVar7)[0] = '\0';
            (puVar1 + sVar7)[1] = '\0';
            buf->off = buf->off + 2;
            iVar2 = 0;
          }
          iVar9 = 6;
          if (iVar2 == 0) {
            sVar7 = buf->off;
            iVar2 = 0;
            if (sVar10 == 0 && ocsp_status.len != 0) {
              iVar2 = ptls_buffer_reserve(buf,2);
              if (iVar2 == 0) {
                puVar1 = buf->base;
                sVar5 = buf->off;
                (puVar1 + sVar5)[0] = '\0';
                (puVar1 + sVar5)[1] = '\x05';
                buf->off = buf->off + 2;
                iVar2 = 0;
              }
              iVar9 = 6;
              if (iVar2 != 0) goto LAB_00108d84;
              iVar2 = ptls_buffer_reserve(buf,2);
              if (iVar2 == 0) {
                puVar1 = buf->base;
                sVar5 = buf->off;
                (puVar1 + sVar5)[0] = '\0';
                (puVar1 + sVar5)[1] = '\0';
                buf->off = buf->off + 2;
                iVar2 = 0;
              }
              iVar9 = 6;
              if (iVar2 == 0) {
                sVar5 = buf->off;
                iVar2 = ptls_buffer_reserve(buf,1);
                if (iVar2 == 0) {
                  buf->base[buf->off] = '\x01';
                  buf->off = buf->off + 1;
                  iVar2 = 0;
                }
                if (iVar2 == 0) {
                  iVar2 = ptls_buffer_reserve(buf,3);
                  if (iVar2 == 0) {
                    puVar1 = buf->base;
                    sVar6 = buf->off;
                    puVar1[sVar6 + 2] = '\0';
                    puVar1 = puVar1 + sVar6;
                    puVar1[0] = '\0';
                    puVar1[1] = '\0';
                    buf->off = buf->off + 3;
                    iVar2 = 0;
                  }
                  iVar9 = 6;
                  if (iVar2 == 0) {
                    sVar6 = buf->off;
                    iVar2 = ptls_buffer__do_pushv(buf,ocsp_status.base,ocsp_status.len);
                    if (iVar2 != 0) goto LAB_00108d20;
                    uVar4 = buf->off - sVar6;
                    lVar3 = 0x10;
                    do {
                      buf->base[sVar6 - 3] = (uint8_t)(uVar4 >> ((byte)lVar3 & 0x3f));
                      lVar3 = lVar3 + -8;
                      sVar6 = sVar6 + 1;
                    } while (lVar3 != -8);
                    iVar9 = 0;
                    bVar11 = true;
                  }
                  else {
LAB_00108d20:
                    bVar11 = false;
                  }
                  if (bVar11) {
                    uVar4 = buf->off - sVar5;
                    lVar3 = 8;
                    do {
                      buf->base[sVar5 - 2] = (uint8_t)(uVar4 >> ((byte)lVar3 & 0x3f));
                      lVar3 = lVar3 + -8;
                      sVar5 = sVar5 + 1;
                    } while (lVar3 != -8);
                    iVar9 = 0;
                  }
                }
              }
              if (iVar9 != 0) goto LAB_00108d84;
            }
            uVar4 = buf->off - sVar7;
            lVar3 = 8;
            do {
              buf->base[sVar7 - 2] = (uint8_t)(uVar4 >> ((byte)lVar3 & 0x3f));
              lVar3 = lVar3 + -8;
              sVar7 = sVar7 + 1;
            } while (lVar3 != -8);
            iVar9 = 0;
          }
LAB_00108d84:
          if (iVar9 != 0) goto LAB_00108dd5;
          sVar10 = sVar10 + 1;
        } while (sVar10 != num_certificates);
        iVar9 = 0;
LAB_00108dd5:
        bVar11 = iVar9 == 0;
      }
      if (bVar11) {
        uVar4 = buf->off - sVar8;
        lVar3 = 0x10;
        do {
          buf->base[sVar8 - 3] = (uint8_t)(uVar4 >> ((byte)lVar3 & 0x3f));
          lVar3 = lVar3 + -8;
          sVar8 = sVar8 + 1;
        } while (lVar3 != -8);
        iVar2 = 0;
      }
    }
  }
  return iVar2;
}

Assistant:

int ptls_build_certificate_message(ptls_buffer_t *buf, ptls_iovec_t context, ptls_iovec_t *certificates, size_t num_certificates,
                                   ptls_iovec_t ocsp_status)
{
    int ret;

    ptls_buffer_push_block(buf, 1, { ptls_buffer_pushv(buf, context.base, context.len); });
    ptls_buffer_push_block(buf, 3, {
        size_t i;
        for (i = 0; i != num_certificates; ++i) {
            ptls_buffer_push_block(buf, 3, { ptls_buffer_pushv(buf, certificates[i].base, certificates[i].len); });
            ptls_buffer_push_block(buf, 2, {
                if (i == 0 && ocsp_status.len != 0) {
                    buffer_push_extension(buf, PTLS_EXTENSION_TYPE_STATUS_REQUEST, {
                        ptls_buffer_push(buf, 1); /* status_type == ocsp */
                        ptls_buffer_push_block(buf, 3, { ptls_buffer_pushv(buf, ocsp_status.base, ocsp_status.len); });
                    });
                }
            });
        }
    });

    ret = 0;
Exit:
    return ret;
}